

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O2

void __thiscall
pzgeom::TPZNodeRep<4,_pztopology::TPZTetrahedron>::Initialize
          (TPZNodeRep<4,_pztopology::TPZTetrahedron> *this,TPZVec<long> *nodeindexes)

{
  ostream *poVar1;
  long lVar2;
  char *local_1c0 [4];
  stringstream sout;
  ostream local_190 [376];
  
  if (3 < nodeindexes->fNElements) {
    lVar2 = 4;
    if (nodeindexes->fNElements == 4) {
      memcpy(this->fNodeIndexes,nodeindexes->fStore,0x20);
      for (; lVar2 != 4; lVar2 = lVar2 + 1) {
        this->fNodeIndexes[lVar2] = -1;
      }
      return;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&sout);
  poVar1 = std::operator<<(local_190,
                           "void pzgeom::TPZNodeRep<4, pztopology::TPZTetrahedron>::Initialize(TPZVec<int64_t> &) [N = 4, Topology = pztopology::TPZTetrahedron]"
                          );
  poVar1 = std::operator<<(poVar1," Nodeindexes have wrong size ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," but should be ");
  std::ostream::operator<<(poVar1,4);
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<((ostream *)&std::cout,local_1c0[0]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_1c0);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/pznoderep.h",
             0x71);
}

Assistant:

void Initialize(TPZVec<int64_t> &nodeindexes)
        {
            int64_t nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifndef PZNODEBUG
            if(nodeindexes.NElements() != N)
            {
                std::stringstream sout;
                sout << __PRETTY_FUNCTION__ << " Nodeindexes have wrong size " << nodeindexes.NElements() << " but should be " << N;
                std::cout << sout.str().c_str() << std::endl;
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int64_t i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
            
        }